

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O3

void cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *this;
  long *plVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  char *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  pointer pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pcVar11;
  cmExecutionStatus status;
  string stack;
  cmListFileFunction newLFF;
  ostringstream error;
  cmListFileArgument arg;
  string local_278;
  cmExecutionStatus local_254;
  cmMakefile *local_250;
  char *local_248;
  char *local_240;
  long *local_238;
  long local_230;
  long local_228 [2];
  cmListFileFunction local_218;
  undefined1 local_1d8 [32];
  Delimiter local_1b8;
  long local_1b0;
  ios_base local_168 [264];
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  undefined4 local_40;
  undefined8 local_38;
  
  if (*client_data != '\0') {
    return;
  }
  *(undefined1 *)client_data = 1;
  local_218.super_cmCommandContext.Name._M_dataplus._M_p =
       (pointer)&local_218.super_cmCommandContext.Name.field_2;
  local_218.super_cmCommandContext.Name._M_string_length = 0;
  local_218.super_cmCommandContext.Name.field_2._M_local_buf[0] = '\0';
  local_218.super_cmCommandContext.Line = 0;
  local_218.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = &local_50;
  local_58 = 0;
  local_50 = 0;
  local_40 = 0;
  local_38 = 0;
  local_250 = mf;
  local_248 = cmVariableWatch::GetAccessAsString(access_type);
  pcVar2 = local_1d8 + 0x10;
  local_1d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CMAKE_CURRENT_LIST_FILE","");
  local_240 = cmMakefile::GetDefinition(local_250,(string *)local_1d8);
  if ((pointer)local_1d8._0_8_ != pcVar2) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  local_1d8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"LISTFILE_STACK","");
  pcVar6 = cmMakefile::GetProperty(local_250,(string *)local_1d8);
  std::__cxx11::string::string((string *)&local_238,pcVar6,(allocator *)&local_278);
  if ((pointer)local_1d8._0_8_ != pcVar2) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  pcVar4 = local_218.Arguments.
           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar3 = local_218.Arguments.
           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(long *)((long)client_data + 0x10) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Variable \"",10);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1d8,(variable->_M_dataplus)._M_p,variable->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" was accessed using ",0x15);
    pcVar6 = local_248;
    if (local_248 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
    }
    else {
      sVar7 = strlen(local_248);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," with value \"",0xd);
    pcVar6 = "";
    if (newValue != (char *)0x0) {
      pcVar6 = newValue;
    }
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(local_250,LOG,&local_278,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
    std::ios_base::~ios_base(local_168);
  }
  else {
    if (local_218.Arguments.
        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_218.Arguments.
        super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
        super__Vector_impl_data._M_start) {
      paVar10 = &((local_218.Arguments.
                   super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                   _M_impl.super__Vector_impl_data._M_start)->Value).field_2;
      do {
        plVar1 = (long *)(((string *)(paVar10 + -1))->_M_dataplus)._M_p;
        if (paVar10 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar1) {
          operator_delete(plVar1,paVar10->_M_allocated_capacity + 1);
        }
        pcVar11 = (pointer)(paVar10 + 2);
        paVar10 = paVar10 + 3;
      } while (pcVar11 != pcVar4);
      local_218.Arguments.
      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3;
    }
    pcVar9 = local_1d8 + 0x10;
    pcVar2 = (variable->_M_dataplus)._M_p;
    local_1d8._0_8_ = pcVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,pcVar2,pcVar2 + variable->_M_string_length);
    this = &local_218.Arguments;
    local_1b8 = Quoted;
    local_1b0 = 9999;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)local_1d8);
    pcVar6 = local_248;
    if ((pointer)local_1d8._0_8_ != pcVar9) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    std::__cxx11::string::string((string *)&local_278,pcVar6,(allocator *)&local_254);
    local_1d8._0_8_ = pcVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
    local_1b8 = Quoted;
    local_1b0 = 9999;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)local_1d8);
    if ((pointer)local_1d8._0_8_ != pcVar9) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    pcVar6 = "";
    if (newValue != (char *)0x0) {
      pcVar6 = newValue;
    }
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    sVar7 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,pcVar6,pcVar6 + sVar7);
    local_1d8._0_8_ = pcVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
    local_1b8 = Quoted;
    local_1b0 = 9999;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)local_1d8);
    if ((pointer)local_1d8._0_8_ != pcVar9) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string((string *)&local_278,local_240,(allocator *)&local_254);
    local_1d8._0_8_ = pcVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
    local_1b8 = Quoted;
    local_1b0 = 9999;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)local_1d8);
    if ((pointer)local_1d8._0_8_ != pcVar9) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    local_1d8._0_8_ = pcVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,local_238,local_230 + (long)local_238);
    local_1b8 = Quoted;
    local_1b0 = 9999;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(this,(cmListFileArgument *)local_1d8);
    if ((pointer)local_1d8._0_8_ != pcVar9) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    std::__cxx11::string::_M_assign((string *)&local_218);
    local_218.super_cmCommandContext.Line = 9999;
    local_254.ReturnInvoked = false;
    local_254.BreakInvoked = false;
    local_254.ContinueInvoked = false;
    local_254.NestedError = false;
    bVar5 = cmMakefile::ExecuteCommand(local_250,&local_218,&local_254);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"Error in cmake code at\nUnknown:0:\n",0x22);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"A command failed during the invocation of callback \"",0x34);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d8,*(char **)((long)client_data + 8),
                          *(long *)((long)client_data + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(local_278._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      *(undefined1 *)client_data = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base(local_168);
      goto LAB_002e272c;
    }
  }
  *(undefined1 *)client_data = 0;
LAB_002e272c:
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
            (&local_218.Arguments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.super_cmCommandContext.Name._M_dataplus._M_p !=
      &local_218.super_cmCommandContext.Name.field_2) {
    operator_delete(local_218.super_cmCommandContext.Name._M_dataplus._M_p,
                    CONCAT71(local_218.super_cmCommandContext.Name.field_2._M_allocated_capacity.
                             _1_7_,local_218.super_cmCommandContext.Name.field_2._M_local_buf[0]) +
                    1);
  }
  return;
}

Assistant:

static void cmVariableWatchCommandVariableAccessed(
  const std::string& variable, int access_type, void* client_data,
  const char* newValue, const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data
    = static_cast<cmVariableWatchCallbackData*>(client_data);

  if ( data->InCallback )
    {
    return;
    }
  data->InCallback = true;

  cmListFileFunction newLFF;
  cmListFileArgument arg;
  bool processed = false;
  const char* accessString = cmVariableWatch::GetAccessAsString(access_type);
  const char* currentListFile = mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = makefile->GetProperty("LISTFILE_STACK");
  if ( !data->Command.empty() )
    {
    newLFF.Arguments.clear();
    newLFF.Arguments.push_back(
      cmListFileArgument(variable, cmListFileArgument::Quoted,
                         9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(accessString, cmListFileArgument::Quoted,
                         9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(newValue?newValue:"", cmListFileArgument::Quoted,
                         9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(currentListFile, cmListFileArgument::Quoted,
                         9999));
    newLFF.Arguments.push_back(
      cmListFileArgument(stack, cmListFileArgument::Quoted,
                         9999));
    newLFF.Name = data->Command;
    newLFF.Line = 9999;
    cmExecutionStatus status;
    if(!makefile->ExecuteCommand(newLFF,status))
      {
      std::ostringstream error;
      error << "Error in cmake code at\nUnknown:0:\n"
        << "A command failed during the invocation of callback \""
        << data->Command << "\".";
      cmSystemTools::Error(error.str().c_str());
      data->InCallback = false;
      return;
      }
    processed = true;
    }
  if ( !processed )
    {
    std::ostringstream msg;
    msg << "Variable \"" << variable << "\" was accessed using "
        << accessString << " with value \"" << (newValue?newValue:"") << "\".";
    makefile->IssueMessage(cmake::LOG, msg.str());
    }

  data->InCallback = false;
}